

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

int __thiscall
flow::IRHandler::verify
          (IRHandler *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  undefined7 extraout_var;
  reference this_00;
  pointer this_01;
  uchar *sig_00;
  EVP_PKEY_CTX *ctx_00;
  unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *bb;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *__range1;
  IRHandler *this_local;
  
  __end1 = std::__cxx11::
           list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ::begin(&this->blocks_);
  bb = (unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *)
       std::__cxx11::
       list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
       ::end(&this->blocks_);
  while( true ) {
    ctx_00 = (EVP_PKEY_CTX *)&bb;
    bVar1 = std::operator!=(&__end1,(_Self *)ctx_00);
    if (!bVar1) break;
    this_00 = std::
              _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
              ::operator*(&__end1);
    this_01 = std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::operator->
                        (this_00);
    BasicBlock::verify(this_01,ctx_00,sig_00,siglen,tbs,tbslen);
    std::_List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
    ::operator++(&__end1);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void IRHandler::verify() {
  for (std::unique_ptr<BasicBlock>& bb : blocks_) {
    bb->verify();
  }
}